

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGccDepfileReader.cxx
# Opt level: O3

bool anon_unknown.dwarf_9faf5::compare
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *actual,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *expected,char *msg)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  pbVar1 = (actual->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (actual->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)pbVar2 - (long)pbVar1;
  pbVar3 = (expected->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (lVar7 == (long)(expected->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3) {
    if (pbVar2 == pbVar1) {
      bVar10 = true;
    }
    else {
      uVar8 = lVar7 >> 5;
      lVar7 = 8;
      uVar9 = 0;
      do {
        sVar5 = *(size_t *)((long)&(pbVar1->_M_dataplus)._M_p + lVar7);
        if (sVar5 != *(size_t *)((long)&(pbVar3->_M_dataplus)._M_p + lVar7)) {
LAB_001af64d:
          if (msg == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0xbf4760);
          }
          else {
            sVar5 = strlen(msg);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,msg,sVar5);
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
          std::ostream::put('`');
          poVar6 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"expected: ",10);
          pbVar1 = (expected->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,*(char **)((long)pbVar1 + lVar7 + -8),
                              *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar7));
          std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
          std::ostream::put((char)poVar6);
          poVar6 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"actual: ",8);
          pbVar1 = (actual->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,*(char **)((long)pbVar1 + lVar7 + -8),
                              *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar7));
          goto LAB_001af812;
        }
        if (sVar5 != 0) {
          iVar4 = bcmp(*(void **)((long)pbVar1 + lVar7 + -8),*(void **)((long)pbVar3 + lVar7 + -8),
                       sVar5);
          if (iVar4 != 0) goto LAB_001af64d;
        }
        uVar9 = uVar9 + 1;
        lVar7 = lVar7 + 0x20;
      } while (uVar8 + (uVar8 == 0) != uVar9);
      bVar10 = uVar8 <= uVar9;
    }
  }
  else {
    if (msg == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0xbf4760);
    }
    else {
      sVar5 = strlen(msg);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,msg,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"expected ",9);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," entries.",9);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Actual number of entries: ",0x1a);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
LAB_001af812:
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool compare(const std::vector<std::string>& actual,
             const std::vector<std::string>& expected, const char* msg)
{
  if (actual.size() != expected.size()) {
    std::cerr << msg << "expected " << expected.size() << " entries."
              << std::endl
              << "Actual number of entries: " << actual.size() << std::endl;
    return false;
  }
  for (std::size_t i = 0; i < actual.size(); ++i) {
    if (actual[i] != expected[i]) {
      std::cerr << msg << std::endl
                << "expected: " << expected[i] << std::endl
                << "actual: " << actual[i] << std::endl;
      return false;
    }
  }
  return true;
}